

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<int> *this;
  char *pcVar1;
  int iVar2;
  ostream *this_00;
  reference pvVar3;
  int *piVar4;
  iterator __first;
  iterator __last;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_d0;
  default_random_engine rng;
  int local_bc;
  undefined1 local_b8 [4];
  int i;
  vector<int_*,_std::allocator<int_*>_> pointers;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> data;
  string local_78 [32];
  int local_58;
  int size;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  char **ppcStack_18;
  int shuffle;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    this_00 = std::operator<<((ostream *)&std::cout,"Usage: random-accesses <shuffle> <size>");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    iVar2 = std::__cxx11::stoi((string *)local_40,(size_t *)0x0,10);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar1 = ppcStack_18[2];
    local_1c = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,pcVar1,
               (allocator *)
               ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    iVar2 = std::__cxx11::stoi((string *)local_78,(size_t *)0x0,10);
    iVar2 = (int)((ulong)(long)iVar2 >> 2);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    this = (allocator<int> *)
           ((long)&pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
    local_58 = iVar2;
    std::allocator<int>::allocator(this);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,(long)iVar2,
               (value_type *)
               ((long)&pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),this);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    std::vector<int_*,_std::allocator<int_*>_>::vector
              ((vector<int_*,_std::allocator<int_*>_> *)local_b8);
    for (local_bc = 0; local_bc < local_58; local_bc = local_bc + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_98,(long)local_bc);
      *pvVar3 = local_bc;
      piVar4 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_98);
      rng._M_x = (unsigned_long)(piVar4 + local_bc);
      std::vector<int_*,_std::allocator<int_*>_>::push_back
                ((vector<int_*,_std::allocator<int_*>_> *)local_b8,(value_type *)&rng);
    }
    if (local_1c == 1) {
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine(&local_d0);
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::seed(&local_d0,0);
      __first = std::vector<int_*,_std::allocator<int_*>_>::begin
                          ((vector<int_*,_std::allocator<int_*>_> *)local_b8);
      __last = std::vector<int_*,_std::allocator<int_*>_>::end
                         ((vector<int_*,_std::allocator<int_*>_> *)local_b8);
      std::
      shuffle<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                 __last._M_current,&local_d0);
    }
    test_memory((vector<int_*,_std::allocator<int_*>_> *)local_b8);
    argv_local._4_4_ = 0;
    std::vector<int_*,_std::allocator<int_*>_>::~vector
              ((vector<int_*,_std::allocator<int_*>_> *)local_b8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: random-accesses <shuffle> <size>" << std::endl;
        return 1;
    }

    int shuffle = std::stoi(argv[1]);
    int size = std::stoi(argv[2]) / sizeof(Type);

    std::vector<Type> data(size, 0);
    std::vector<Type*> pointers;
    for (int i = 0; i < size; i++)
    {
        data[i] = i;
        pointers.push_back(data.data() + i);
    }

    if (shuffle == 1)
    {
        std::default_random_engine rng;
        rng.seed(0);
        std::shuffle(pointers.begin(), pointers.end(), rng);
    }

    test_memory(pointers);

    return 0;
}